

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O0

void test_convert<int,float>(uint length,int value)

{
  bool bVar1;
  int *__p;
  float *__p_00;
  element_type *pSrc;
  element_type *pDst;
  undefined8 *puVar2;
  uint local_2ec;
  uint i_1;
  float *u;
  int *t;
  undefined1 local_2c8 [8];
  shared_ptr<float> pu;
  shared_ptr<int> pt;
  int value_local;
  uint length_local;
  int i;
  undefined8 uStack_290;
  uint local_284;
  element_type *local_280;
  int local_278;
  int local_274;
  element_type *local_270;
  uint *local_268;
  int local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  element_type *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  element_type *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  element_type *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  element_type *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  element_type *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  element_type *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  element_type *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  element_type *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  element_type *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  element_type *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  element_type *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  element_type *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  element_type *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  element_type *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  __p = sse::common::malloc<int>(length);
  std::shared_ptr<int>::shared_ptr<int,void(*)(int*),void>
            ((shared_ptr<int> *)
             &pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             sse::common::free<int>);
  __p_00 = sse::common::malloc<float>(length);
  std::shared_ptr<float>::shared_ptr<float,void(*)(float*),void>
            ((shared_ptr<float> *)local_2c8,__p_00,sse::common::free<float>);
  pSrc = std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)
                    &pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pDst = std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)local_2c8);
  _length_local = CONCAT44(value,value);
  uStack_290 = CONCAT44(value,value);
  local_268 = &length_local;
  local_270 = pSrc;
  for (local_274 = (int)length >> 2; 3 < local_274; local_274 = local_274 + -4) {
    local_110 = local_270;
    local_f0 = local_270;
    *(undefined8 *)local_270 = _length_local;
    *(undefined8 *)(local_270 + 2) = uStack_290;
    local_130 = local_270 + 4;
    *(undefined8 *)local_130 = _length_local;
    *(undefined8 *)(local_270 + 6) = uStack_290;
    local_150 = local_270 + 8;
    *(undefined8 *)local_150 = _length_local;
    *(undefined8 *)(local_270 + 10) = uStack_290;
    local_170 = local_270 + 0xc;
    *(undefined8 *)local_170 = _length_local;
    *(undefined8 *)(local_270 + 0xe) = uStack_290;
    local_270 = local_270 + 0x10;
    local_258 = _length_local;
    uStack_250 = uStack_290;
    local_248 = _length_local;
    uStack_240 = uStack_290;
    local_238 = _length_local;
    uStack_230 = uStack_290;
    local_228 = _length_local;
    uStack_220 = uStack_290;
    local_188 = _length_local;
    uStack_180 = uStack_290;
    local_168 = _length_local;
    uStack_160 = uStack_290;
    local_148 = _length_local;
    uStack_140 = uStack_290;
    local_128 = _length_local;
    uStack_120 = uStack_290;
    local_108 = _length_local;
    uStack_100 = uStack_290;
    local_e8 = _length_local;
    uStack_e0 = uStack_290;
    local_d0 = local_130;
    local_c8 = _length_local;
    uStack_c0 = uStack_290;
    local_b0 = local_150;
    local_a8 = _length_local;
    uStack_a0 = uStack_290;
    local_90 = local_170;
  }
  if (1 < local_274) {
    local_190 = local_270;
    local_70 = local_270;
    *(undefined8 *)local_270 = _length_local;
    *(undefined8 *)(local_270 + 2) = uStack_290;
    local_1b0 = local_270 + 4;
    *(undefined8 *)local_1b0 = _length_local;
    *(undefined8 *)(local_270 + 6) = uStack_290;
    local_274 = local_274 + -2;
    local_270 = local_270 + 8;
    local_218 = _length_local;
    uStack_210 = uStack_290;
    local_208 = _length_local;
    uStack_200 = uStack_290;
    local_1c8 = _length_local;
    uStack_1c0 = uStack_290;
    local_1a8 = _length_local;
    uStack_1a0 = uStack_290;
    local_88 = _length_local;
    uStack_80 = uStack_290;
    local_68 = _length_local;
    uStack_60 = uStack_290;
    local_50 = local_1b0;
  }
  if (local_274 != 0) {
    local_1d0 = local_270;
    local_30 = local_270;
    *(undefined8 *)local_270 = _length_local;
    *(undefined8 *)(local_270 + 2) = uStack_290;
    local_1f8 = _length_local;
    uStack_1f0 = uStack_290;
    local_1e8 = _length_local;
    uStack_1e0 = uStack_290;
    local_48 = _length_local;
    uStack_40 = uStack_290;
  }
  for (value_local = length - (length & 3); value_local < (int)length; value_local = value_local + 1
      ) {
    pSrc[value_local] = value;
  }
  local_284 = length;
  local_280 = pSrc;
  local_278 = value;
  local_25c = value;
  local_28 = _length_local;
  uStack_20 = uStack_290;
  local_18 = value;
  local_14 = value;
  local_10 = value;
  local_c = value;
  sse::common::convert<int,float>(pSrc,pDst,length);
  local_2ec = 0;
  while( true ) {
    if (length <= local_2ec) {
      std::shared_ptr<float>::~shared_ptr((shared_ptr<float> *)local_2c8);
      std::shared_ptr<int>::~shared_ptr
                ((shared_ptr<int> *)
                 &pu.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    bVar1 = anon_unknown.dwarf_8d70::equal<float>(pDst[local_2ec],(float)value);
    if (!bVar1) break;
    local_2ec = local_2ec + 1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = int, _U = float]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}